

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

void whisper_kv_cache_seq_rm
               (whisper_kv_cache *cache,whisper_seq_id seq_id,whisper_pos p0,whisper_pos p1)

{
  bool bVar1;
  reference pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint *in_RDI;
  uint32_t i;
  uint32_t new_head;
  key_type *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  uint uVar4;
  
  uVar4 = in_RDI[1];
  if (in_EDX < 0) {
    in_EDX = 0;
  }
  if (in_ECX < 0) {
    in_ECX = std::numeric_limits<int>::max();
  }
  uVar3 = 0;
  do {
    if (in_RDI[1] <= uVar3) {
      if (uVar4 != in_RDI[1]) {
        *in_RDI = uVar4;
      }
      return;
    }
    pvVar2 = std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                       ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)(in_RDI + 4),
                        (ulong)uVar3);
    if ((in_EDX <= pvVar2->pos) &&
       (pvVar2 = std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                           ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)
                            (in_RDI + 4),(ulong)uVar3), pvVar2->pos < in_ECX)) {
      if (in_ESI < 0) {
        std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                  ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)(in_RDI + 4),
                   (ulong)uVar3);
        std::set<int,_std::less<int>,_std::allocator<int>_>::clear
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1f1741);
      }
      else {
        std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                  ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)(in_RDI + 4),
                   (ulong)uVar3);
        bVar1 = whisper_kv_cell::has_seq_id
                          ((whisper_kv_cell *)CONCAT44(in_ESI,in_EDX),
                           (whisper_seq_id *)CONCAT44(in_ECX,uVar4));
        if (!bVar1) goto LAB_001f17f1;
        std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                  ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)(in_RDI + 4),
                   (ulong)uVar3);
        std::set<int,_std::less<int>,_std::allocator<int>_>::erase
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)
                   CONCAT44(uVar3,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
      }
      std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)(in_RDI + 4),
                 (ulong)uVar3);
      bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1f17b5);
      if (bVar1) {
        pvVar2 = std::vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>::operator[]
                           ((vector<whisper_kv_cell,_std::allocator<whisper_kv_cell>_> *)
                            (in_RDI + 4),(ulong)uVar3);
        pvVar2->pos = -1;
        if (uVar4 == in_RDI[1]) {
          uVar4 = uVar3;
        }
      }
    }
LAB_001f17f1:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

static void whisper_kv_cache_seq_rm(
        struct whisper_kv_cache & cache,
                 whisper_seq_id   seq_id,
                    whisper_pos   p0,
                    whisper_pos   p1) {
    uint32_t new_head = cache.size;

    if (p0 < 0) p0 = 0;
    if (p1 < 0) p1 = std::numeric_limits<whisper_pos>::max();

    for (uint32_t i = 0; i < cache.size; ++i) {
        if (cache.cells[i].pos >= p0 && cache.cells[i].pos < p1) {
            if (seq_id < 0) {
                cache.cells[i].seq_id.clear();
            } else if (cache.cells[i].has_seq_id(seq_id)) {
                cache.cells[i].seq_id.erase(seq_id);
            } else {
                continue;
            }
            if (cache.cells[i].seq_id.empty()) {
                cache.cells[i].pos = -1;
                if (new_head == cache.size) new_head = i;
            }
        }
    }

    // If we freed up a slot, set head to it so searching can start there.
    if (new_head != cache.size) cache.head = new_head;
}